

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O0

void printf_btr_at91(can_bittiming *bt,_Bool hdr)

{
  byte in_SIL;
  long in_RDI;
  uint32_t br;
  
  if ((in_SIL & 1) == 0) {
    printf("0x%08x",(ulong)(*(int *)(in_RDI + 0x14) - 1U | (*(int *)(in_RDI + 0x10) + -1) * 0x10 |
                            (*(int *)(in_RDI + 0xc) + -1) * 0x100 |
                            (*(int *)(in_RDI + 0x18) + -1) * 0x1000 |
                           (*(int *)(in_RDI + 0x1c) + -1) * 0x10000));
  }
  else {
    printf("%10s","CAN_BR");
  }
  return;
}

Assistant:

static void printf_btr_at91(struct can_bittiming *bt, bool hdr)
{
	if (hdr) {
		printf("%10s", "CAN_BR");
	} else {
		uint32_t br = ((bt->phase_seg2 - 1) |
			       ((bt->phase_seg1 - 1) << 4) |
			       ((bt->prop_seg - 1) << 8) |
			       ((bt->sjw - 1) << 12) |
			       ((bt->brp - 1) << 16));
		printf("0x%08x", br);
	}
}